

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection_segment.cpp
# Opt level: O3

idx_t __thiscall
duckdb::ColumnDataCollectionSegment::ReadVector
          (ColumnDataCollectionSegment *this,ChunkManagementState *state,
          VectorDataIndex vector_index,Vector *result)

{
  vector<duckdb::VectorMetaData,_true> *this_00;
  vector<duckdb::VectorDataIndex,_true> *this_01;
  pointer pSVar1;
  VectorDataIndex vector_index_00;
  bool bVar2;
  vector<duckdb::VectorMetaData,_true> *pvVar3;
  reference pvVar4;
  ColumnDataAllocator *pCVar5;
  reference pvVar6;
  reference pvVar7;
  Vector *result_00;
  idx_t size;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_02;
  reference this_03;
  type result_01;
  undefined1 *puVar8;
  InternalException *this_04;
  long lVar9;
  PhysicalType PVar10;
  size_type __n;
  vector<duckdb::VectorMetaData,_true> *pvVar11;
  SwizzleMetaData *swizzle_segment;
  pointer pSVar12;
  reference local_90;
  string local_50;
  
  this_00 = &this->vector_data;
  PVar10 = (result->type).physical_type_;
  local_90 = vector<duckdb::VectorMetaData,_true>::operator[](this_00,vector_index.index);
  if (local_90->count == 0) {
    return (idx_t)(vector<duckdb::VectorMetaData,_true> *)0x0;
  }
  this_01 = &this->child_indices;
  bVar2 = false;
  pvVar11 = this_00;
  while (pvVar3 = (vector<duckdb::VectorMetaData,_true> *)
                  ReadVectorInternal(this,state,vector_index,result), PVar10 == ARRAY) {
    result = ArrayVector::GetEntry(result);
    pvVar4 = vector<duckdb::VectorDataIndex,_true>::operator[]
                       (this_01,(local_90->child_index).index);
    vector_index.index = pvVar4->index;
    if (!bVar2) {
      pvVar11 = pvVar3;
    }
    PVar10 = (result->type).physical_type_;
    local_90 = vector<duckdb::VectorMetaData,_true>::operator[](this_00,vector_index.index);
    bVar2 = true;
    if (local_90->count == 0) {
      return (idx_t)pvVar11;
    }
  }
  if (PVar10 == LIST) {
    result_00 = ListVector::GetEntry(result);
    pvVar4 = vector<duckdb::VectorDataIndex,_true>::operator[]
                       (this_01,(local_90->child_index).index);
    size = ReadVector(this,state,(VectorDataIndex)pvVar4->index,result_00);
    ListVector::SetListSize(result,size);
    if (bVar2) {
      return (idx_t)pvVar11;
    }
    return (idx_t)pvVar3;
  }
  if (PVar10 == STRUCT) {
    this_02 = StructVector::GetEntries(result);
    if ((this_02->
        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this_02->
        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        pvVar4 = vector<duckdb::VectorDataIndex,_true>::operator[]
                           (this_01,(local_90->child_index).index + __n);
        vector_index_00.index = pvVar4->index;
        this_03 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](this_02,__n);
        result_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (this_03);
        puVar8 = (undefined1 *)ReadVector(this,state,vector_index_00,result_01);
        if ((vector<duckdb::VectorMetaData,_true> *)puVar8 != pvVar3) {
          this_04 = (InternalException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Column Data Collection: mismatch in struct child sizes",""
                    );
          InternalException::InternalException(this_04,&local_50);
          __cxa_throw(this_04,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(this_02->
                                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_02->
                                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  else if (PVar10 == VARCHAR) {
    pCVar5 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
    if ((pCVar5->type == BUFFER_MANAGER_ALLOCATOR) && (vector_index.index != 0xffffffffffffffff)) {
      lVar9 = 0;
      do {
        pvVar6 = vector<duckdb::VectorMetaData,_true>::operator[](this_00,vector_index.index);
        pSVar1 = (pvVar6->swizzle_data).
                 super_vector<duckdb::SwizzleMetaData,_std::allocator<duckdb::SwizzleMetaData>_>.
                 super__Vector_base<duckdb::SwizzleMetaData,_std::allocator<duckdb::SwizzleMetaData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pSVar12 = (pvVar6->swizzle_data).
                       super_vector<duckdb::SwizzleMetaData,_std::allocator<duckdb::SwizzleMetaData>_>
                       .
                       super__Vector_base<duckdb::SwizzleMetaData,_std::allocator<duckdb::SwizzleMetaData>_>
                       ._M_impl.super__Vector_impl_data._M_start; pSVar12 != pSVar1;
            pSVar12 = pSVar12 + 1) {
          pvVar7 = vector<duckdb::VectorMetaData,_true>::operator[]
                             (this_00,(pSVar12->child_index).index);
          pCVar5 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
          ColumnDataAllocator::UnswizzlePointers
                    (pCVar5,state,result,(ulong)pSVar12->offset + lVar9,pSVar12->count,
                     pvVar7->block_id,pvVar7->offset);
        }
        lVar9 = lVar9 + (ulong)pvVar6->count;
        vector_index.index = (pvVar6->next_data).index;
      } while (vector_index.index != 0xffffffffffffffff);
    }
    if (state->properties == DISALLOW_ZERO_COPY) {
      VectorOperations::Copy(result,result,(ulong)local_90->count,0,0);
    }
  }
  if (bVar2) {
    return (idx_t)pvVar11;
  }
  return (idx_t)pvVar3;
}

Assistant:

idx_t ColumnDataCollectionSegment::ReadVector(ChunkManagementState &state, VectorDataIndex vector_index,
                                              Vector &result) {
	auto &vector_type = result.GetType();
	auto internal_type = vector_type.InternalType();
	auto &vdata = GetVectorData(vector_index);
	if (vdata.count == 0) {
		return 0;
	}
	auto vcount = ReadVectorInternal(state, vector_index, result);
	if (internal_type == PhysicalType::LIST) {
		// list: copy child
		auto &child_vector = ListVector::GetEntry(result);
		auto child_count = ReadVector(state, GetChildIndex(vdata.child_index), child_vector);
		ListVector::SetListSize(result, child_count);
	} else if (internal_type == PhysicalType::ARRAY) {
		auto &child_vector = ArrayVector::GetEntry(result);
		auto child_count = ReadVector(state, GetChildIndex(vdata.child_index), child_vector);
		(void)child_count;
	} else if (internal_type == PhysicalType::STRUCT) {
		auto &child_vectors = StructVector::GetEntries(result);
		for (idx_t child_idx = 0; child_idx < child_vectors.size(); child_idx++) {
			auto child_count =
			    ReadVector(state, GetChildIndex(vdata.child_index, child_idx), *child_vectors[child_idx]);
			if (child_count != vcount) {
				throw InternalException("Column Data Collection: mismatch in struct child sizes");
			}
		}
	} else if (internal_type == PhysicalType::VARCHAR) {
		if (allocator->GetType() == ColumnDataAllocatorType::BUFFER_MANAGER_ALLOCATOR) {
			auto next_index = vector_index;
			idx_t offset = 0;
			while (next_index.IsValid()) {
				auto &current_vdata = GetVectorData(next_index);
				for (auto &swizzle_segment : current_vdata.swizzle_data) {
					auto &string_heap_segment = GetVectorData(swizzle_segment.child_index);
					allocator->UnswizzlePointers(state, result, offset + swizzle_segment.offset, swizzle_segment.count,
					                             string_heap_segment.block_id, string_heap_segment.offset);
				}
				offset += current_vdata.count;
				next_index = current_vdata.next_data;
			}
		}
		if (state.properties == ColumnDataScanProperties::DISALLOW_ZERO_COPY) {
			VectorOperations::Copy(result, result, vdata.count, 0, 0);
		}
	}
	return vcount;
}